

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Int
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,int i)

{
  bool bVar1;
  U local_28;
  Number n;
  int i_local;
  Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  local_28 = (U)(long)i;
  n.u = (U)(double)i;
  n.d._4_4_ = i;
  bVar1 = WriteNumber(this,(Number *)&local_28);
  return bVar1;
}

Assistant:

bool Int(int i) { Number n; n.u.i = i; n.d = static_cast<double>(i); return WriteNumber(n); }